

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<char_const(&)[11],float&>
               (string *s,char *fmt,char (*v) [11],float *args)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *in_RDX;
  float *in_RSI;
  string *in_RDI;
  string *unaff_retaddr;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string local_248 [24];
  string *in_stack_fffffffffffffdd0;
  char **in_stack_fffffffffffffdd8;
  char (*in_stack_fffffffffffffde0) [11];
  char *in_stack_fffffffffffffde8;
  string local_200 [32];
  stringstream local_1e0 [16];
  ostream local_1d0 [24];
  char *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  LogLevel in_stack_fffffffffffffe64;
  string local_40 [40];
  char *local_18;
  
  local_18 = in_RDX;
  copyToFormatString(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  lVar1 = std::__cxx11::string::find((char)local_40,0x2a);
  lVar2 = std::__cxx11::string::find((char)local_40,0x73);
  lVar3 = std::__cxx11::string::find((char)local_40,100);
  if (lVar1 != -1) {
    LogFatal(in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
             in_stack_fffffffffffffe48);
  }
  if (lVar3 != -1) {
    LogFatal(in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
             in_stack_fffffffffffffe48);
  }
  if (lVar2 == -1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
               in_stack_fffffffffffffe48);
    }
    std::__cxx11::string::c_str();
    formatOne<char_const(&)[11]>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    std::__cxx11::string::operator+=(in_RDI,local_248);
    std::__cxx11::string::~string(local_248);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1e0);
    std::operator<<(local_1d0,local_18);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    formatOne<char_const*>(in_stack_fffffffffffffde8,(char **)in_stack_fffffffffffffde0);
    std::__cxx11::string::operator+=(in_RDI,local_200);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    std::__cxx11::stringstream::~stringstream(local_1e0);
  }
  stringPrintfRecursive<float&>(unaff_retaddr,(char *)in_RDI,in_RSI);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}